

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceValidators.cpp
# Opt level: O3

Result * CoreML::validateCanModelBeUpdatable(Result *__return_storage_ptr__,Model *format)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint32 uVar2;
  string err;
  string local_58;
  Result local_38;
  
  Result::Result(&local_38);
  uVar2 = format->_oneof_case_[0];
  if ((int)uVar2 < 0x193) {
    if ((uVar2 - 200 < 3) || (uVar2 == 0x12f)) {
LAB_004ddf3d:
      __return_storage_ptr__->m_type = local_38.m_type;
      __return_storage_ptr__->m_reason = local_38.m_reason;
      paVar1 = &(__return_storage_ptr__->m_message).field_2;
      (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38.m_message._M_dataplus._M_p == &local_38.m_message.field_2) {
        paVar1->_M_allocated_capacity = local_38.m_message.field_2._M_allocated_capacity;
        *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) =
             local_38.m_message.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_38.m_message._M_dataplus._M_p;
        (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
             local_38.m_message.field_2._M_allocated_capacity;
      }
      (__return_storage_ptr__->m_message)._M_string_length = local_38.m_message._M_string_length;
      return __return_storage_ptr__;
    }
  }
  else if ((uVar2 - 0x193 < 2) || (uVar2 == 500)) goto LAB_004ddf3d;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_replace((ulong)&local_58,0,(char *)0x0,0x60cb15);
  Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_PARAMETERS,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                             local_58.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38.m_message._M_dataplus._M_p != &local_38.m_message.field_2) {
    operator_delete(local_38.m_message._M_dataplus._M_p,
                    local_38.m_message.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result validateCanModelBeUpdatable(const Specification::Model& format) {
        Result r;
        switch (format.Type_case()) {
            case Specification::Model::kNeuralNetwork:
            case Specification::Model::kNeuralNetworkRegressor:
            case Specification::Model::kNeuralNetworkClassifier:
            case Specification::Model::kKNearestNeighborsClassifier:
            case Specification::Model::kPipeline:
            case Specification::Model::kPipelineRegressor:
            case Specification::Model::kPipelineClassifier:
                return r;
            default: {
                std::string err;
                err = "This model type is not supported for on-device update.";
                return Result(ResultType::INVALID_UPDATABLE_MODEL_PARAMETERS, err);
            }
        }
    }